

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint __val;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar9;
  typed_value<float,_char> *ptVar10;
  const_iterator cVar11;
  long *plVar12;
  any *paVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  float *pfVar15;
  ostream *poVar16;
  ulong *puVar17;
  undefined8 *puVar18;
  ulong *extraout_RAX;
  ulong *extraout_RAX_00;
  ulong uVar19;
  long *plVar20;
  uint __len;
  ulong *puVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  Mat inputImage;
  string inputPath;
  string __str;
  string outputPath;
  string modelPath;
  CascadeClassifier cascade;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> detectedFaces;
  FileStorage fs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argList;
  options_description desc;
  variables_map vm;
  uint local_3d4;
  undefined1 local_3d0 [64];
  int *local_390;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  string local_350;
  ulong *local_330;
  undefined8 local_328;
  ulong local_320;
  undefined8 uStack_318;
  ulong *local_310;
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  CascadeClassifier local_288 [16];
  undefined1 local_278 [16];
  long local_268;
  undefined1 local_258 [16];
  long local_248;
  undefined1 local_238 [8];
  undefined4 uStack_230;
  undefined4 uStack_22c;
  path local_228 [2];
  undefined8 local_1c8;
  undefined8 local_1c0;
  _InputArray local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  undefined8 local_188;
  int local_180;
  int local_17c;
  long *local_178 [2];
  long local_168 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_150 [24];
  void *local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  long local_118;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_110 [24];
  undefined1 local_f8 [2] [16];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a0,argv,
             argv + argc,(allocator_type *)local_d0);
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  pcVar1 = local_3d0 + 0x10;
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Options for helium","");
  boost::program_options::options_description::options_description
            ((options_description *)local_178,(string *)local_3d0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_2a8._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_2a8,"help");
  ptVar9 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar9->m_required = true;
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"input",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar9->m_required = true;
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"out","");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3d0);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"output",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar2 = &local_228[0]._M_pathname.field_2;
  local_228[0]._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"internal","");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,&local_228[0]._M_pathname);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"model",(char *)ptVar9);
  ptVar10 = boost::program_options::value<float>((float *)0x0);
  local_2e8._M_dataplus._M_p._0_4_ = 0x40000000;
  ptVar10 = boost::program_options::typed_value<float,_char>::default_value
                      (ptVar10,(float *)&local_2e8);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"zoom",(char *)ptVar10);
  ptVar10 = boost::program_options::value<float>((float *)0x0);
  local_370 = (long *)CONCAT44(local_370._4_4_,0x3d4ccccd);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"0.05","");
  ptVar10 = boost::program_options::typed_value<float,_char>::default_value
                      (ptVar10,(float *)&local_370,&local_350);
  boost::program_options::options_description_easy_init::operator()
            (pcVar8,(value_semantic *)"min-size",(char *)ptVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_228[0]._M_pathname._M_dataplus._M_p,
                    local_228[0]._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_f8[0] = (undefined1  [16])0x0;
  local_f8[1] = (undefined1  [16])0x0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_3d0,argc,argv,(options_description *)local_178,0,
             (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_f8);
  boost::program_options::store((basic_parsed_options *)local_3d0,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_3d0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_f8);
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"help","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_c0,(key_type *)local_3d0);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (argc == 1 || cVar11._M_node != &local_b8) {
    plVar12 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)local_178);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    iVar6 = 1;
    std::ostream::flush();
    goto LAB_0010874a;
  }
  boost::program_options::notify((variables_map *)local_d0);
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"input","");
  paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  pcVar3 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,pcVar3,pcVar3 + pbVar14->_M_string_length);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"model","");
  paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  pcVar3 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,pcVar3,pcVar3 + pbVar14->_M_string_length);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"output","");
  paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  pcVar3 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,pcVar3,pcVar3 + pbVar14->_M_string_length);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"zoom","");
  paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pfVar15 = boost::any_cast<float_const&>(paVar13);
  _local_238 = ZEXT416((uint)*pfVar15);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"min-size","");
  paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pfVar15 = boost::any_cast<float_const&>(paVar13);
  local_310 = (ulong *)CONCAT44(local_310._4_4_,*pfVar15);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_3d0,&local_350,auto_format);
  cVar5 = std::filesystem::status((path *)local_3d0);
  std::filesystem::__cxx11::path::~path((path *)local_3d0);
  if (cVar5 == '\x01') {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_3d0,&local_2e8,auto_format);
    cVar5 = std::filesystem::status((path *)local_3d0);
    std::filesystem::__cxx11::path::~path((path *)local_3d0);
    if (cVar5 != '\x02') {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_3d0,&local_2e8,auto_format);
      cVar5 = std::filesystem::create_directory((path *)local_3d0);
      std::filesystem::__cxx11::path::~path((path *)local_3d0);
      if (cVar5 == '\0') {
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_2e8._M_dataplus._M_p,
                             local_2e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," is not a directory and could not be created.",0x2d);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        goto LAB_00107eef;
      }
    }
    cv::imread((string *)local_3d0,(int)&local_350);
    cVar5 = cv::Mat::empty();
    if (cVar5 == '\0') {
      cv::CascadeClassifier::CascadeClassifier(local_288);
      iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
      if (iVar6 == 0) {
        cv::FileStorage::FileStorage((FileStorage *)local_228);
        local_370 = &local_360;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_370,
                   "<?xml version=\"1.0\"?>\n<!--\n    Tree-based 20x20 gentle adaboost frontal face detector.\n    Created by Rainer Lienhart.\n\n////////////////////////////////////////////////////////////////////////////////////////\n\n  IMPORTANT: READ BEFORE DOWNLOADING, COPYING, INSTALLING OR USING.\n\n  By downloading, copying, installing or using the software you agree to this license.\n  If you do not agree to this license, do not download, install,\n  copy or use the software.\n\n\n                        Intel License Agreement\n                For Open Source Computer Vision Library\n\n Copyright (C) 2000, Intel Corporation, all rights reserved.\n Third party copyrights are property of their respective owners.\n\n Redistribution and use in source and binary forms, with or without modification,\n are permitted provided that the following conditions are met:\n\n   * Redistribution\'s of source code must retain the above copyright notice,\n     this list of conditions and the following disclaimer.\n\n   * Redistribution\'s in binary form must reproduce the above copyright notice,\n     this list of conditions and the following disclaimer in the documentation\n     and/or other materials provided with the distribution.\n\n   * The name of Intel Corporation may not be used to endorse or promote products\n     derived from this software without specific prior written permission.\n\n This software is provided by the copyright holders and contributors \"as is\" and\n any express or implied warranties, including, but not limited to, the implied\n warranties of merchantability and fitness for a particular purpose are disclaimed.\n In no event shall the Intel Corporation or contributors be liable for any direct,\n indirect, incidental, special, exemplary, or consequential damages\n (including, but not limited to, procurement of substitute goods or services;\n loss of use, data, or profits; or business interruption) however caused\n and on any theory of liability, whether in contract, strict liability,\n or tort (including negligence or otherwise) arising in any way out of\n the ..." /* TRUNCATED STRING LITERAL */
                   ,"");
        local_328 = 0;
        local_320 = local_320 & 0xffffffffffffff00;
        local_330 = &local_320;
        cv::FileStorage::open((string *)local_228,(int)&local_370,(string *)0x4);
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if (local_370 != &local_360) {
          operator_delete(local_370,local_360 + 1);
        }
        cv::FileStorage::getFirstTopLevelNode();
        cv::CascadeClassifier::read((FileNode *)local_288);
        cv::FileStorage::~FileStorage((FileStorage *)local_228);
LAB_001080ac:
        iVar6 = local_390[1];
        if (local_390[1] < *local_390) {
          iVar6 = *local_390;
        }
        local_180 = (int)(local_310._0_4_ * (float)iVar6);
        local_248 = 0;
        local_258 = ZEXT416(0);
        local_228[0]._M_pathname.field_2._M_allocated_capacity = 0;
        local_228[0]._M_pathname._M_dataplus._M_p._0_4_ = 0x1010000;
        local_188 = 0;
        local_228[0]._M_pathname._M_string_length = (size_type)local_3d0;
        local_17c = local_180;
        cv::CascadeClassifier::detectMultiScale
                  (0x3ff199999999999a,local_288,local_228,local_258,3,0,&local_180,&local_188);
        local_310 = (ulong *)local_258._8_8_;
        if (local_258._0_8_ != local_258._8_8_) {
          local_238._4_4_ = local_238._0_4_;
          uStack_230 = local_238._0_4_;
          uStack_22c = local_238._0_4_;
          local_3d4 = 1;
          puVar17 = (ulong *)local_258._8_8_;
          puVar21 = (ulong *)local_258._0_8_;
          do {
            iVar24 = (int)((float)(int)puVar21[1] * (float)local_238._0_4_);
            iVar25 = (int)((float)(int)(puVar21[1] >> 0x20) * (float)local_238._4_4_);
            local_1c0 = CONCAT44(iVar25,iVar24);
            iVar22 = ((int)puVar21[1] - iVar24) / 2 + (int)*puVar21;
            iVar23 = ((int)(puVar21[1] >> 0x20) - iVar25) / 2 + (int)(*puVar21 >> 0x20);
            local_1c8 = CONCAT44(iVar23,iVar22);
            auVar26._4_4_ = iVar22;
            auVar26._0_4_ = iVar22;
            auVar26._8_4_ = iVar23;
            auVar26._12_4_ = iVar23;
            iVar6 = movmskpd((int)puVar17,auVar26);
            if (iVar6 == 0) {
              if ((local_390[1] < iVar22 + iVar24) || (*local_390 < iVar23 + iVar25))
              goto LAB_00108203;
              local_2c8 = local_2b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2c8,local_2e8._M_dataplus._M_p,
                         local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
              std::__cxx11::string::append((char *)&local_2c8);
              __val = -local_3d4;
              if (0 < (int)local_3d4) {
                __val = local_3d4;
              }
              __len = 1;
              if (9 < __val) {
                uVar19 = (ulong)__val;
                uVar4 = 4;
                do {
                  __len = uVar4;
                  uVar7 = (uint)uVar19;
                  if (uVar7 < 100) {
                    __len = __len - 2;
                    goto LAB_001083a5;
                  }
                  if (uVar7 < 1000) {
                    __len = __len - 1;
                    goto LAB_001083a5;
                  }
                  if (uVar7 < 10000) goto LAB_001083a5;
                  uVar19 = uVar19 / 10000;
                  uVar4 = __len + 4;
                } while (99999 < uVar7);
                __len = __len + 1;
              }
LAB_001083a5:
              local_308 = local_2f8;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_308,(char)__len - (char)((int)local_3d4 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((ulong)(local_3d4 >> 0x1f) + (long)local_308),__len,__val);
              uVar19 = 0xf;
              if (local_2c8 != local_2b8) {
                uVar19 = local_2b8[0];
              }
              if (uVar19 < (ulong)(local_300 + local_2c0)) {
                uVar19 = 0xf;
                if (local_308 != local_2f8) {
                  uVar19 = local_2f8[0];
                }
                if (uVar19 < (ulong)(local_300 + local_2c0)) goto LAB_00108458;
                puVar18 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_308,0,(char *)0x0,(ulong)local_2c8);
              }
              else {
LAB_00108458:
                puVar18 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_308);
              }
              puVar17 = puVar18 + 2;
              if ((ulong *)*puVar18 == puVar17) {
                local_320 = *puVar17;
                uStack_318 = puVar18[3];
                local_330 = &local_320;
              }
              else {
                local_320 = *puVar17;
                local_330 = (ulong *)*puVar18;
              }
              local_328 = puVar18[1];
              *puVar18 = puVar17;
              puVar18[1] = 0;
              *(undefined1 *)puVar17 = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_330);
              local_370 = &local_360;
              plVar20 = plVar12 + 2;
              if ((long *)*plVar12 == plVar20) {
                local_360 = *plVar20;
                lStack_358 = plVar12[3];
              }
              else {
                local_360 = *plVar20;
                local_370 = (long *)*plVar12;
              }
              local_368 = plVar12[1];
              *plVar12 = (long)plVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              cv::Mat::Mat((Mat *)local_228,(Mat *)local_3d0,(Rect_ *)&local_1c8);
              local_1b8.sz.width = 0;
              local_1b8.sz.height = 0;
              local_1b8.flags = 0x1010000;
              local_268 = 0;
              local_278 = (undefined1  [16])0x0;
              local_1b8.obj = local_228;
              cv::imwrite((string *)&local_370,&local_1b8,(vector *)local_278);
              if ((void *)local_278._0_8_ != (void *)0x0) {
                operator_delete((void *)local_278._0_8_,local_268 - local_278._0_8_);
              }
              cv::Mat::~Mat((Mat *)local_228);
              if (local_370 != &local_360) {
                operator_delete(local_370,local_360 + 1);
              }
              if (local_330 != &local_320) {
                operator_delete(local_330,local_320 + 1);
              }
              puVar17 = local_2f8;
              if (local_308 != puVar17) {
                operator_delete(local_308,local_2f8[0] + 1);
                puVar17 = extraout_RAX;
              }
              if (local_2c8 != local_2b8) {
                operator_delete(local_2c8,local_2b8[0] + 1);
                puVar17 = extraout_RAX_00;
              }
              local_3d4 = local_3d4 + 1;
            }
            else {
LAB_00108203:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Face ",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
              poVar16 = (ostream *)std::ostream::operator<<(&std::cerr,(int)puVar21[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," x ",3);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,*(int *)((long)puVar21 + 0xc));
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," from (",7);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)*puVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,*(int *)((long)puVar21 + 4));
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,")]",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16," could not be saved (zoom too large)",0x24);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
              std::ostream::put((char)poVar16);
              puVar17 = (ulong *)std::ostream::flush();
            }
            puVar21 = puVar21 + 2;
          } while (puVar21 != local_310);
        }
        if ((ulong *)local_258._0_8_ != (ulong *)0x0) {
          operator_delete((void *)local_258._0_8_,local_248 - local_258._0_8_);
        }
        iVar6 = 0;
      }
      else {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (local_228,&local_2a8,auto_format);
        cVar5 = std::filesystem::status(local_228);
        std::filesystem::__cxx11::path::~path(local_228);
        if (cVar5 == '\x01') {
          cv::CascadeClassifier::load((string *)local_288);
          goto LAB_001080ac;
        }
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_2a8._M_dataplus._M_p,
                             local_2a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," does not exist.",0x10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        iVar6 = -1;
        std::ostream::flush();
      }
      cv::CascadeClassifier::~CascadeClassifier(local_288);
    }
    else {
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_350._M_dataplus._M_p,
                           local_350._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," couldn\'t be read",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      iVar6 = -1;
      std::ostream::flush();
    }
    cv::Mat::~Mat((Mat *)local_3d0);
  }
  else {
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_350._M_dataplus._M_p,local_350._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," is not a file.",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
LAB_00107eef:
    std::ostream::put((char)poVar16);
    iVar6 = -1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
LAB_0010874a:
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_110);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_118 - (long)local_138);
    local_138 = (void *)0x0;
    local_130 = 0;
    local_128 = 0;
    local_120 = 0;
    local_118 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_150);
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  local_d0[0] = std::streambuf::sync;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0);
  return iVar6;
}

Assistant:

int main(int argc, char **argv) {
  std::vector<std::string> argList(argv, argv + argc);
  po::variables_map vm;

  // Get options
  po::options_description desc("Options for helium");
  desc.add_options()("help", "produce help message")(
      "input", po::value<std::string>()->required(), "input file")(
      "output", po::value<std::string>()->required()->default_value("out"),
      "output folder")(
      "model", po::value<std::string>()->default_value("internal"),
      "model file ('internal' to use haarcascade_frontalface_alt2)")(
      "zoom", po::value<float>()->default_value(2),
      "zoom factor (0.5 = half size, 2 = double size)")(
      "min-size", po::value<float>()->default_value(0.05, "0.05"),
      "minimum face size (0.05 = 5% of image size, 0.5 = 50% of image "
      "size)");
  po::store(po::parse_command_line(argc, argv, desc), vm);

  // Return help message
  if (vm.count("help") || argc == 1) {
    std::cout << desc << std::endl;
    return 1;
  }

  // Raise errors about incorrect options
  po::notify(vm);

  // Cast variables from  variable map
  const std::string inputPath = vm["input"].as<std::string>();
  const std::string modelPath = vm["model"].as<std::string>();
  const std::string outputPath = vm["output"].as<std::string>();
  const float zoomLevel = vm["zoom"].as<float>();
  const float minimumSize = vm["min-size"].as<float>();

  // Error if input path is not a file
  if (!fs::is_regular_file(inputPath)) {
    std::cerr << inputPath << " is not a file." << std::endl;
    return -1;
  }

  // Ensure the output path exists or can be created
  if (!fs::is_directory(outputPath)) {
    if (!fs::create_directory(outputPath)) {
      std::cerr << outputPath << " is not a directory and could not be created."
                << std::endl;
      return -1;
    }
  }

  // Load the input image
  cv::Mat inputImage = cv::imread(inputPath);

  // Error if image is empty
  if (inputImage.empty()) {
    std::cerr << inputPath << " couldn't be read" << std::endl;
    return -1;
  }

  // Initialize cascade classifier
  CascadeClassifier cascade;

  if (modelPath == "internal") {
    // Open in-memory model
    cv::FileStorage fs;
    fs.open(std::string(cascade_model),
            FileStorage::READ | FileStorage::MEMORY);

    // Load model into cascade classifier
    cascade.read(fs.getFirstTopLevelNode());
  } else {
    // Error if model path is not a file
    if (!fs::is_regular_file(modelPath)) {
      std::cerr << modelPath << " does not exist." << std::endl;
      return -1;
    }

    // Load model into cascade classifier
    cascade.load(modelPath);
  }

  // The minimum size for detected faces is based on the larger of the
  // image's sides multiplied by a ratio
  const int greatestImageSideLength =
      max(inputImage.size().height, inputImage.size().width);
  const int minimumFaceLength = (greatestImageSideLength * minimumSize);
  cv::Size minimumFaceSize = cv::Size(minimumFaceLength, minimumFaceLength);

  // Use the cascade model to detect faces as Rects in detectedFaces
  std::vector<Rect> detectedFaces;
  cascade.detectMultiScale(inputImage, detectedFaces, 1.1, 3, 0,
                           minimumFaceSize);

  // Loop over every detected face
  int imageId = 1;
  for (const Rect &faceArea : detectedFaces) {
    // Set the crop rectangle to the detected face before performing zoom
    // transformation
    Rect cropRectangle = faceArea;

    // Apply the zoom level
    cropRectangle.width = faceArea.width * zoomLevel;
    cropRectangle.height = faceArea.height * zoomLevel;

    cropRectangle.x += ((faceArea.width - cropRectangle.width) / 2);
    cropRectangle.y += ((faceArea.height - cropRectangle.height) / 2);

    // If the new crop rectangle would try to read nonexistent pixels, skip
    if ((cropRectangle.x < 0) || (cropRectangle.y < 0) ||
        ((cropRectangle.x + cropRectangle.width) > inputImage.size().width) ||
        ((cropRectangle.y + cropRectangle.height) > inputImage.size().height)) {
      std::cerr << "Face " << faceArea << " could not be saved (zoom too large)"
                << std::endl;
      continue;
    }

    // Write a cropped version of the image
    cv::imwrite((outputPath + "/" + std::to_string(imageId) + ".jpg"),
                inputImage(cropRectangle));

    imageId++;
  }
  return 0;
}